

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O0

void __thiscall
TEST_WiningStateTest_OneShot_TestShell::TEST_WiningStateTest_OneShot_TestShell
          (TEST_WiningStateTest_OneShot_TestShell *this)

{
  TEST_WiningStateTest_OneShot_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)&PTR__TEST_WiningStateTest_OneShot_TestShell_0025bd50;
  return;
}

Assistant:

TEST(WiningStateTest, OneShot)
{
	addNoWiningHand();
	h.readyHand();

	WinByDiscardSituation situation;
	situation.is_one_shot = true;

	winByDiscard(situation);
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::ReadyHand));
	CHECK_EQUAL(1, r.patterns.count(Pattern::OneShot));
	CHECK_EQUAL(2, r.doubling_factor);
}